

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.cpp
# Opt level: O1

void duckdb::ProgressBar::SystemOverrideCheck(ClientConfig *config)

{
  InvalidInputException *this;
  string local_40;
  
  if (config->system_progress_bar_disable_reason == (char *)0x0) {
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not change the progress bar setting because: \'%s\'","");
  InvalidInputException::InvalidInputException<char_const*>
            (this,&local_40,config->system_progress_bar_disable_reason);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ProgressBar::SystemOverrideCheck(ClientConfig &config) {
	if (config.system_progress_bar_disable_reason != nullptr) {
		throw InvalidInputException("Could not change the progress bar setting because: '%s'",
		                            config.system_progress_bar_disable_reason);
	}
}